

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglClientExtensionTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::anon_unknown_0::BaseTest::iterate(BaseTest *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  deUint32 errCode;
  deBool dVar4;
  Library *pLVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  Error *this_01;
  TestError *this_02;
  istream *piVar6;
  TestLog *this_03;
  MessageBuilder *this_04;
  MessageBuilder local_380;
  undefined1 local_200 [8];
  string extension;
  string local_1d8 [32];
  istringstream local_1b8 [8];
  istringstream stream;
  bool found;
  EGLint eglError;
  char *clientExtesionsStr;
  Library *egl;
  BaseTest *this_local;
  
  pLVar5 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  iVar3 = (*pLVar5->_vptr_Library[0x2a])(pLVar5,0,0x3055);
  errCode = (*pLVar5->_vptr_Library[0x1f])();
  if (errCode == 0x3008) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"EGL_EXT_client_extensions not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglClientExtensionTests.cpp"
               ,0x8d);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if (errCode != 0x3000) {
    this_01 = (Error *)__cxa_allocate_exception(0x38);
    eglu::Error::Error(this_01,errCode,"eglQueryString()",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglClientExtensionTests.cpp"
                       ,0x8f);
    __cxa_throw(this_01,&eglu::Error::typeinfo,eglu::Error::~Error);
  }
  do {
    dVar4 = ::deGetFalse();
    if ((dVar4 != 0) || ((char *)CONCAT44(extraout_var,iVar3) == (char *)0x0)) {
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,(char *)0x0,"clientExtesionsStr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglClientExtensionTests.cpp"
                 ,0x91);
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  bVar1 = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,(char *)CONCAT44(extraout_var,iVar3),
             (allocator<char> *)(extension.field_2._M_local_buf + 0xf));
  std::__cxx11::istringstream::istringstream(local_1b8,local_1d8,_S_in);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)(extension.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_200);
  do {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,(string *)local_200,' ');
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
    if (!bVar2) goto LAB_01792323;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_200,"EGL_EXT_client_extensions");
  } while (!bVar2);
  bVar1 = true;
LAB_01792323:
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    this_03 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_380,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
    this_04 = tcu::MessageBuilder::operator<<
                        (&local_380,
                         (char (*) [123])
                         "eglQueryString(EGL_NO_DISPLAY, EGL_EXTENSIONS) didn\'t fail, but extension string doesn\'t contain EGL_EXT_client_extensions"
                        );
    tcu::MessageBuilder::operator<<(this_04,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_380);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::istringstream::~istringstream(local_1b8);
  return STOP;
}

Assistant:

TestCase::IterateResult BaseTest::iterate (void)
{
	const Library&		egl					= m_eglTestCtx.getLibrary();
	const char* const	clientExtesionsStr	= egl.queryString(EGL_NO_DISPLAY, EGL_EXTENSIONS);
	const EGLint		eglError			= egl.getError();

	if (eglError == EGL_BAD_DISPLAY)
		TCU_THROW(NotSupportedError, "EGL_EXT_client_extensions not supported");
	else if (eglError != EGL_SUCCESS)
		throw eglu::Error(eglError, "eglQueryString()", DE_NULL, __FILE__, __LINE__);

	TCU_CHECK(clientExtesionsStr);

	{
		bool				found		= false;
		std::istringstream	stream		(clientExtesionsStr);
		string				extension;

		while (std::getline(stream, extension, ' '))
		{
			if (extension == "EGL_EXT_client_extensions")
			{
				found = true;
				break;
			}
		}

		if (found)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
		{
			m_testCtx.getLog() << TestLog::Message << "eglQueryString(EGL_NO_DISPLAY, EGL_EXTENSIONS) didn't fail, but extension string doesn't contain EGL_EXT_client_extensions" <<TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}